

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_functions_to_test.hpp
# Opt level: O0

void duckdb::udf_max_constant<int>(DataChunk *args,ExpressionState *state,Vector *result)

{
  bool bVar1;
  idx_t iVar2;
  int *piVar3;
  VectorType in_DL;
  int *result_data;
  int *input_data;
  value_type *input;
  idx_t col_idx;
  int max;
  ulong __n;
  vector<duckdb::Vector,_true> *in_stack_ffffffffffffffc0;
  ulong local_28;
  int local_1c;
  
  local_1c = 0;
  duckdb::Vector::SetVectorType(in_DL);
  local_28 = 0;
  while (__n = local_28, iVar2 = DataChunk::ColumnCount((DataChunk *)0x4ca2e6), __n < iVar2) {
    vector<duckdb::Vector,_true>::operator[](in_stack_ffffffffffffffc0,__n);
    bVar1 = ConstantVector::IsNull((Vector *)0x4ca310);
    if ((!bVar1) && (piVar3 = ConstantVector::GetData<int>((Vector *)0x4ca322), local_1c < *piVar3))
    {
      local_1c = *piVar3;
    }
    local_28 = local_28 + 1;
  }
  piVar3 = ConstantVector::GetData<int>((Vector *)0x4ca35b);
  *piVar3 = local_1c;
  return;
}

Assistant:

static void udf_max_constant(DataChunk &args, ExpressionState &state, Vector &result) {
	TYPE max = 0;
	result.SetVectorType(VectorType::CONSTANT_VECTOR);
	for (idx_t col_idx = 0; col_idx < args.ColumnCount(); col_idx++) {
		auto &input = args.data[col_idx];
		if (ConstantVector::IsNull(input)) {
			// constant null, skip
			continue;
		}
		auto input_data = ConstantVector::GetData<TYPE>(input);
		if (max < input_data[0]) {
			max = input_data[0];
		}
	}
	auto result_data = ConstantVector::GetData<TYPE>(result);
	result_data[0] = max;
}